

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::PackSnorm2x16Case::iterate(PackSnorm2x16Case *this)

{
  uint uVar1;
  ShaderExecutor *pSVar2;
  deUint32 dVar3;
  deInt32 dVar4;
  int iVar5;
  char *pcVar6;
  size_type sVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  reference pvVar10;
  float *pfVar11;
  reference pvVar12;
  float fVar13;
  int local_720;
  int local_71c;
  int local_70c;
  MessageBuilder local_708;
  MessageBuilder local_588;
  Hex<8UL> local_408;
  Hex<8UL> local_400;
  MessageBuilder local_3f8;
  int local_278;
  int local_274;
  int diff1;
  int diff0;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  deUint16 ref1;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  void *out;
  void *in;
  MessageBuilder local_238;
  Vector<float,_2> local_b4;
  float local_ac;
  float local_a8;
  float y_1;
  float x_1;
  int ndx_1;
  float local_98;
  float local_94;
  float y;
  float x;
  int ndx;
  Vector<float,_2> local_84;
  Vector<float,_2> local_7c;
  Vector<float,_2> local_74 [3];
  Vector<float,_2> local_5c;
  int local_54;
  undefined1 local_50 [4];
  int maxDiff;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  Random rnd;
  PackSnorm2x16Case *this_local;
  
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar6);
  de::Random::Random((Random *)
                     &inputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar3 ^ 0x776002);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  if (this->m_precision == PRECISION_HIGHP) {
    local_71c = 1;
  }
  else {
    if (this->m_precision == PRECISION_MEDIUMP) {
      local_720 = 0x21;
    }
    else {
      local_720 = 0;
      if (this->m_precision == PRECISION_LOWP) {
        local_720 = 0x81;
      }
    }
    local_71c = local_720;
  }
  local_54 = local_71c;
  tcu::Vector<float,_2>::Vector(&local_5c,0.0,0.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_5c);
  tcu::Vector<float,_2>::Vector(local_74,-1.0,1.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_74);
  tcu::Vector<float,_2>::Vector(&local_7c,0.5,-0.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_7c);
  tcu::Vector<float,_2>::Vector(&local_84,-1.5,1.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_84);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&x,0.25,-0.75);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&x);
  for (y = 0.0; (int)y < 0xf; y = (float)((int)y + 1)) {
    fVar13 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_94 = fVar13 * 2.5 + -1.25;
    fVar13 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_98 = fVar13 * 2.5 + -1.25;
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&x_1,local_94,local_98);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&x_1);
  }
  for (y_1 = 0.0; (int)y_1 < 0x50; y_1 = (float)((int)y_1 + 1)) {
    fVar13 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_a8 = fVar13 * 1e+06 + -500000.0;
    fVar13 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_ac = fVar13 * 1e+06 + -500000.0;
    tcu::Vector<float,_2>::Vector(&local_b4,local_a8,local_ac);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_b4);
  }
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar7);
  pTVar8 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_238,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                         ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(unsigned_long *)&in);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  out = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0);
  _maxPrints = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pSVar2->_vptr_ShaderExecutor[6])(pSVar2,sVar7 & 0xffffffff,&out,&maxPrints);
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar7;
  valNdx = 10;
  _ref1 = 0;
  for (ref = 0; (int)ref < numFailed; ref = ref + 1) {
    pvVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
    pfVar11 = tcu::Vector<float,_2>::x(pvVar10);
    fVar13 = de::clamp<float>(*pfVar11,-1.0,1.0);
    dVar4 = ::deRoundFloatToInt32(fVar13 * 32767.0);
    iVar5 = de::clamp<int>(dVar4,-0x8000,0x7fff);
    res._2_2_ = (ushort)iVar5;
    pvVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
    pfVar11 = tcu::Vector<float,_2>::y(pvVar10);
    fVar13 = de::clamp<float>(*pfVar11,-1.0,1.0);
    dVar4 = ::deRoundFloatToInt32(fVar13 * 32767.0);
    iVar5 = de::clamp<int>(dVar4,-0x8000,0x7fff);
    res._0_2_ = (ushort)iVar5;
    _res1 = CONCAT22((ushort)res,res._2_2_);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                         (long)(int)ref);
    uVar1 = *pvVar12;
    diff0._0_2_ = (undefined2)uVar1;
    diff1._2_2_ = (undefined2)diff0;
    diff0._2_2_ = (ushort)(uVar1 >> 0x10);
    diff1._0_2_ = diff0._2_2_;
    diff0 = uVar1;
    local_274 = de::abs<int>((uint)res._2_2_ - (uVar1 & 0xffff));
    local_278 = de::abs<int>((uint)(ushort)res - (uint)(ushort)diff1);
    if ((local_54 < local_274) || (local_54 < local_278)) {
      if (_ref1 < 10) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3f8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_3f8,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&ref);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [26])", expected packSnorm2x16(");
        pvVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)&outputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,pvVar10);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])0x2bd2712);
        local_400 = tcu::toHex<unsigned_int>(_res1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_400);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0x2c67b94);
        local_408 = tcu::toHex<unsigned_int>(diff0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_408);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])"\n  diffs = (");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_274);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_278);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])"), max diff = ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_54);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3f8);
      }
      else if (_ref1 == 10) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_588,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_588,(char (*) [4])0x2b5ff3d);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_588);
      }
      _ref1 = _ref1 + 1;
    }
  }
  pTVar8 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_708,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  local_70c = numFailed - _ref1;
  pMVar9 = tcu::MessageBuilder::operator<<(&local_708,&local_70c);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])0x2b9720c);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&numFailed);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_708);
  pcVar6 = "Result comparison failed";
  if (_ref1 == 0) {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(_ref1 != 0),pcVar6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      &inputs.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}